

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O0

void __thiscall eglu::NativeDisplay::~NativeDisplay(NativeDisplay *this)

{
  NativeDisplay *this_local;
  
  this->_vptr_NativeDisplay = (_func_int **)&PTR__NativeDisplay_0158fb58;
  std::__cxx11::string::~string((string *)&this->m_platformExtension);
  return;
}

Assistant:

NativeDisplay::~NativeDisplay (void)
{
}